

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4m.cpp
# Opt level: O0

bool ReadD4M(MemFile *file,shared_ptr<Disk> *disk)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  bool bVar7;
  int iVar8;
  ulong uVar9;
  element_type *peVar10;
  Data *data;
  element_type *peVar11;
  size_t in_RCX;
  FILE *__stream;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  undefined1 local_164 [8];
  Format fmt;
  uint8_t ab [256];
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  iVar8 = MemFile::size(file);
  if ((((iVar8 == 0x32a000) && (bVar7 = MemFile::seek(file,0x320800), bVar7)) &&
      (uVar9 = MemFile::read(file,(int)&fmt + 0x34,(void *)0x100,in_RCX), (uVar9 & 1) != 0)) &&
     ((short)fmt.gap3 == 0x101)) {
    cVar12 = -(fmt._59_1_ == 'S');
    cVar13 = -(ab[0] == 'T');
    cVar14 = -(ab[1] == 'E');
    cVar15 = -(ab[2] == 'M');
    cVar16 = -(ab[3] == 0xa0);
    cVar17 = -(ab[4] == 0xa0);
    cVar18 = -(ab[5] == 0xa0);
    cVar19 = -(ab[6] == 0xa0);
    cVar20 = -(ab[7] == 0xa0);
    cVar21 = -(ab[8] == 0xa0);
    cVar22 = -(ab[9] == 0xa0);
    cVar23 = -(ab[10] == 0xa0);
    cVar24 = -(ab[0xb] == 0xa0);
    bVar25 = -(ab[0xc] == 0xa0);
    auVar1[1] = -(fmt._58_1_ == 'Y');
    auVar1[0] = -(fmt.cyls_first == true);
    auVar1[2] = cVar12;
    auVar1[3] = cVar13;
    auVar1[4] = cVar14;
    auVar1[5] = cVar15;
    auVar1[6] = cVar16;
    auVar1[7] = cVar17;
    auVar1[8] = cVar18;
    auVar1[9] = cVar19;
    auVar1[10] = cVar20;
    auVar1[0xb] = cVar21;
    auVar1[0xc] = cVar22;
    auVar1[0xd] = cVar23;
    auVar1[0xe] = cVar24;
    auVar1[0xf] = bVar25;
    auVar2[1] = -(fmt._58_1_ == 'Y');
    auVar2[0] = -(fmt.cyls_first == true);
    auVar2[2] = cVar12;
    auVar2[3] = cVar13;
    auVar2[4] = cVar14;
    auVar2[5] = cVar15;
    auVar2[6] = cVar16;
    auVar2[7] = cVar17;
    auVar2[8] = cVar18;
    auVar2[9] = cVar19;
    auVar2[10] = cVar20;
    auVar2[0xb] = cVar21;
    auVar2[0xc] = cVar22;
    auVar2[0xd] = cVar23;
    auVar2[0xe] = cVar24;
    auVar2[0xf] = bVar25;
    auVar6[1] = cVar13;
    auVar6[0] = cVar12;
    auVar6[2] = cVar14;
    auVar6[3] = cVar15;
    auVar6[4] = cVar16;
    auVar6[5] = cVar17;
    auVar6[6] = cVar18;
    auVar6[7] = cVar19;
    auVar6[8] = cVar20;
    auVar6[9] = cVar21;
    auVar6[10] = cVar22;
    auVar6[0xb] = cVar23;
    auVar6[0xc] = cVar24;
    auVar6[0xd] = bVar25;
    auVar5[1] = cVar14;
    auVar5[0] = cVar13;
    auVar5[2] = cVar15;
    auVar5[3] = cVar16;
    auVar5[4] = cVar17;
    auVar5[5] = cVar18;
    auVar5[6] = cVar19;
    auVar5[7] = cVar20;
    auVar5[8] = cVar21;
    auVar5[9] = cVar22;
    auVar5[10] = cVar23;
    auVar5[0xb] = cVar24;
    auVar5[0xc] = bVar25;
    auVar4[1] = cVar15;
    auVar4[0] = cVar14;
    auVar4[2] = cVar16;
    auVar4[3] = cVar17;
    auVar4[4] = cVar18;
    auVar4[5] = cVar19;
    auVar4[6] = cVar20;
    auVar4[7] = cVar21;
    auVar4[8] = cVar22;
    auVar4[9] = cVar23;
    auVar4[10] = cVar24;
    auVar4[0xb] = bVar25;
    auVar3[1] = cVar16;
    auVar3[0] = cVar15;
    auVar3[2] = cVar17;
    auVar3[3] = cVar18;
    auVar3[4] = cVar19;
    auVar3[5] = cVar20;
    auVar3[6] = cVar21;
    auVar3[7] = cVar22;
    auVar3[8] = cVar23;
    auVar3[9] = cVar24;
    auVar3[10] = bVar25;
    if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar25,CONCAT18(cVar24,CONCAT17(cVar23,CONCAT16(cVar22,
                                                  CONCAT15(cVar21,CONCAT14(cVar20,CONCAT13(cVar19,
                                                  CONCAT12(cVar18,CONCAT11(cVar17,cVar16))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar25,CONCAT17(cVar24,CONCAT16(cVar23,CONCAT15(cVar22,
                                                  CONCAT14(cVar21,CONCAT13(cVar20,CONCAT12(cVar19,
                                                  CONCAT11(cVar18,cVar17)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar25 >> 7) << 0xf) == 0xffff) {
      __stream = (FILE *)0x18;
      Format::Format((Format *)local_164,D4M);
      MemFile::rewind(file,__stream);
      std::swap<int>(&fmt.interleave,&fmt.skew);
      peVar10 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           disk);
      data = MemFile::data(file);
      Disk::format(peVar10,(Format *)local_164,data,false);
      peVar10 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           disk);
      peVar11 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           disk);
      std::swap<int>(&(peVar10->fmt).head0,&(peVar11->fmt).head1);
      peVar10 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           disk);
      Disk::flip_sides(peVar10);
      peVar10 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           disk);
      std::__cxx11::string::operator=((string *)&peVar10->strType,"D4M");
      return true;
    }
  }
  return false;
}

Assistant:

bool ReadD4M(MemFile& file, std::shared_ptr<Disk>& disk)
{
    // D4M is a fixed-size image
    uint8_t ab[256];
    if (file.size() != D4M_DISK_SIZE || !file.seek(D4M_PARTITION_OFFSET) || !file.read(&ab, sizeof(ab)))
        return false;

    // Check a partition starts at track 1 sector 1, with "SYSTEM" name
    if (memcmp(ab, "\x01\x01", 2) || memcmp(ab + 5, "SYSTEM\xa0\xa0\xa0\xa0\xa0\xa0\xa0\xa0\xa0\xa0", 16))
        return false;

    Format fmt{ RegularFormat::D4M };

    // D2M stores the sides in the reverse order, so fiddle things to read it easily
    file.rewind();
    std::swap(fmt.head0, fmt.head1);
    disk->format(fmt, file.data());
    std::swap(disk->fmt.head0, disk->fmt.head1);
    disk->flip_sides();
    disk->strType = "D4M";

    return true;
}